

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cpp
# Opt level: O3

void embree::alignedUSMFree(void *ptr)

{
  if (ptr == (void *)0x0) {
    return;
  }
  free(ptr);
  return;
}

Assistant:

void alignedUSMFree(void* ptr)
  {
#if defined(EMBREE_SYCL_SUPPORT)
    if (tls_context)
      return alignedSYCLFree(tls_context,ptr);
    else
#endif
      return alignedFree(ptr);
  }